

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmComputeLinkDepends.cxx
# Opt level: O2

void __thiscall cmComputeLinkDepends::InferDependencies(cmComputeLinkDepends *this)

{
  _Rb_tree_header *p_Var1;
  _Rb_tree_header *p_Var2;
  pointer ppDVar3;
  DependSetList *pDVar4;
  _Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *__x;
  pointer pDVar5;
  pointer pcVar6;
  _Base_ptr p_Var7;
  pointer pDVar8;
  uint uVar9;
  ulong uVar10;
  bool local_a1;
  cmComputeLinkDepends *local_a0;
  DependSet intersection;
  DependSet common;
  
  p_Var1 = &intersection.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
            super__Rb_tree_header;
  p_Var2 = &common.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
            super__Rb_tree_header;
  uVar9 = 0;
  local_a0 = this;
  while( true ) {
    uVar10 = (ulong)uVar9;
    ppDVar3 = (local_a0->InferredDependSets).
              super__Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
              ._M_impl.super__Vector_impl_data._M_start;
    if ((ulong)((long)(local_a0->InferredDependSets).
                      super__Vector_base<cmComputeLinkDepends::DependSetList_*,_std::allocator<cmComputeLinkDepends::DependSetList_*>_>
                      ._M_impl.super__Vector_impl_data._M_finish - (long)ppDVar3 >> 3) <= uVar10)
    break;
    pDVar4 = ppDVar3[uVar10];
    if ((pDVar4 != (DependSetList *)0x0) &&
       (__x = *(_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> **)
               &(pDVar4->
                super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                ).
                super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                ._M_impl,
       __x != *(_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> **)
               ((long)&(pDVar4->
                       super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                       ).
                       super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                       ._M_impl + 8))) {
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 &common,__x);
      pDVar5 = *(pointer *)
                ((long)&(pDVar4->
                        super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                        ).
                        super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                        ._M_impl + 8);
      pDVar8 = *(pointer *)
                &(pDVar4->
                 super_vector<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                 ).
                 super__Vector_base<cmComputeLinkDepends::DependSet,_std::allocator<cmComputeLinkDepends::DependSet>_>
                 ._M_impl;
      while (pDVar8 + 1 != pDVar5) {
        intersection.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
        super__Rb_tree_header._M_header._0_8_ =
             intersection.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
             super__Rb_tree_header._M_header._0_8_ & 0xffffffff00000000;
        intersection.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
        super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
        intersection.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
        super__Rb_tree_header._M_node_count = 0;
        intersection.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
        super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
        intersection.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
        super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
        std::
        __set_intersection<std::_Rb_tree_const_iterator<int>,std::_Rb_tree_const_iterator<int>,std::insert_iterator<cmComputeLinkDepends::DependSet>,__gnu_cxx::__ops::_Iter_less_iter>
                  (common.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
                   super__Rb_tree_header._M_header._M_left,p_Var2,
                   *(_Base_ptr *)
                    ((long)&pDVar8[1].super_set<int,_std::less<int>,_std::allocator<int>_>._M_t.
                            _M_impl + 0x18),
                   (_Rb_tree_header *)
                   ((long)&pDVar8[1].super_set<int,_std::less<int>,_std::allocator<int>_>._M_t.
                           _M_impl + 8),
                   (_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                   &intersection,p_Var1);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        operator=((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  &common,(_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>
                           *)&intersection);
        std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::
        ~_Rb_tree((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                  &intersection);
        pDVar8 = pDVar8 + 1;
      }
      pcVar6 = (local_a0->EntryConstraintGraph).
               super_vector<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>.
               super__Vector_base<cmGraphEdgeList,_std::allocator<cmGraphEdgeList>_>._M_impl.
               super__Vector_impl_data._M_start;
      std::vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>::reserve
                ((vector<cmGraphEdge,_std::allocator<cmGraphEdge>_> *)(pcVar6 + uVar10),
                 ((long)*(pointer *)
                         ((long)&pcVar6[uVar10].
                                 super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                                 super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_> + 8)
                 - *(long *)&pcVar6[uVar10].super_vector<cmGraphEdge,_std::allocator<cmGraphEdge>_>.
                             super__Vector_base<cmGraphEdge,_std::allocator<cmGraphEdge>_>) / 0x18 +
                 common.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
                 super__Rb_tree_header._M_node_count);
      for (p_Var7 = common.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
                    super__Rb_tree_header._M_header._M_left; (_Rb_tree_header *)p_Var7 != p_Var2;
          p_Var7 = (_Base_ptr)std::_Rb_tree_increment(p_Var7)) {
        local_a1 = true;
        intersection.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl._0_8_ = 0;
        intersection.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
        super__Rb_tree_header._M_header._M_color = _S_red;
        intersection.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
        super__Rb_tree_header._M_header._4_4_ = 0;
        std::vector<cmGraphEdge,std::allocator<cmGraphEdge>>::
        emplace_back<int_const&,bool,cmListFileBacktrace>
                  ((vector<cmGraphEdge,std::allocator<cmGraphEdge>> *)(pcVar6 + uVar10),
                   (int *)(p_Var7 + 1),&local_a1,(cmListFileBacktrace *)&intersection);
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                  ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                   &intersection.super_set<int,_std::less<int>,_std::allocator<int>_>._M_t._M_impl.
                    super__Rb_tree_header);
      }
      std::_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_>::~_Rb_tree
                ((_Rb_tree<int,_int,_std::_Identity<int>,_std::less<int>,_std::allocator<int>_> *)
                 &common);
    }
    uVar9 = uVar9 + 1;
  }
  return;
}

Assistant:

void cmComputeLinkDepends::InferDependencies()
{
  // The inferred dependency sets for each item list the possible
  // dependencies.  The intersection of the sets for one item form its
  // inferred dependencies.
  for (unsigned int depender_index = 0;
       depender_index < this->InferredDependSets.size(); ++depender_index) {
    // Skip items for which dependencies do not need to be inferred or
    // for which the inferred dependency sets are empty.
    DependSetList* sets = this->InferredDependSets[depender_index];
    if (!sets || sets->empty()) {
      continue;
    }

    // Intersect the sets for this item.
    DependSet common = sets->front();
    for (DependSet const& i : cmMakeRange(*sets).advance(1)) {
      DependSet intersection;
      std::set_intersection(common.begin(), common.end(), i.begin(), i.end(),
                            std::inserter(intersection, intersection.begin()));
      common = intersection;
    }

    // Add the inferred dependencies to the graph.
    cmGraphEdgeList& edges = this->EntryConstraintGraph[depender_index];
    edges.reserve(edges.size() + common.size());
    for (auto const& c : common) {
      edges.emplace_back(c, true, cmListFileBacktrace());
    }
  }
}